

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O3

json_value * json_parse_ex(json_settings *settings,char *json,size_t length,char *error_buf)

{
  json_value *pjVar1;
  double dVar2;
  ushort uVar3;
  bool bVar4;
  json_value *pjVar5;
  _func_void_void_ptr_void_ptr *p_Var6;
  void *pvVar7;
  uchar uVar8;
  byte bVar9;
  uchar uVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  ushort **ppuVar14;
  anon_union_8_2_291a86ad_for__reserved *paVar15;
  long lVar16;
  json_value **ppjVar17;
  ulong uVar18;
  byte *pbVar19;
  char *pcVar20;
  byte bVar21;
  uint uVar22;
  _json_value *p_Var23;
  uint uVar24;
  json_type jVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  char error [128];
  _json_value *local_180;
  json_value *local_178;
  char *local_170;
  long local_168;
  json_value *local_160;
  json_state local_158;
  json_value *local_f0;
  long local_e8;
  long local_e0;
  ulong local_d8;
  uint local_cc;
  byte *local_c8;
  byte *local_c0;
  ulong local_b8;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  undefined2 uStack_a8;
  char acStack_a6 [118];
  
  if ((((2 < length) && (*json == -0x11)) && (json[1] == -0x45)) && (json[2] == -0x41)) {
    json = json + 3;
    length = length - 3;
  }
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_158.settings.max_memory = settings->max_memory;
  local_158.settings._8_8_ = *(undefined8 *)&settings->settings;
  local_158.settings.memory_alloc = settings->memory_alloc;
  local_158.settings.memory_free = settings->memory_free;
  local_158.settings.user_data = settings->user_data;
  local_158.settings.value_extra = settings->value_extra;
  if (local_158.settings.memory_alloc == (_func_void_ptr_size_t_int_void_ptr *)0x0) {
    local_158.settings.memory_alloc = default_alloc;
  }
  pbVar19 = (byte *)json + length;
  if (local_158.settings.memory_free == (_func_void_void_ptr_void_ptr *)0x0) {
    local_158.settings.memory_free = default_free;
  }
  local_c0 = pbVar19 + -1;
  local_e0 = 0;
  local_e8 = 0;
  local_f0 = (json_value *)0x0;
  local_158.first_pass = 1;
  local_158._76_4_ = 0;
  local_158.ulong_max = 0xfffffffffffffff7;
  local_158.uint_max = 0xfffffff7;
  local_158._12_4_ = 0;
  local_158.used_memory = 0;
  local_168 = 0;
  local_160 = (json_value *)0x0;
  local_178 = (json_value *)0x0;
  local_158.cur_line = 1;
  local_158.cur_col = 0;
  uVar22 = 8;
  bVar4 = false;
  local_180 = (_json_value *)0x0;
  uVar27 = 0;
  local_c8 = (byte *)json;
LAB_00130a86:
  pjVar5 = local_178;
  uVar24 = (uint)uVar27;
  local_158.ptr = json;
  if ((byte *)json == pbVar19) {
    if ((uVar22 & 0x20) == 0) {
      uVar28 = 0;
      goto LAB_00130ae7;
    }
LAB_001319ac:
    uVar18 = local_158._88_8_ & 0xffffffff;
    uVar27 = (ulong)local_158.cur_col;
    pcVar20 = "Unexpected EOF in string (at %d:%d)";
    goto LAB_001319da;
  }
  bVar9 = *json;
  uVar28 = (uint)bVar9;
  if ((uVar22 & 0x20) == 0) {
LAB_00130ae7:
    bVar9 = (byte)uVar28;
    if ((local_158.settings._8_8_ & 1) == 0) {
code_r0x00130afb:
      if ((uVar22 & 8) == 0) {
        jVar25 = local_178->type;
        if (jVar25 - json_integer < 2) {
          ppuVar14 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar14 + (long)(char)bVar9 * 2 + 1) & 8) == 0) {
            if (bVar9 == 0x2b) {
LAB_00130b59:
              if ((uVar22 & 0xc00) != 0x400) {
LAB_001311ff:
                if ((uVar22 >> 10 & 1) != 0) goto LAB_0013142f;
                if (jVar25 == json_double) goto LAB_00131398;
LAB_001313ea:
                if ((bVar9 & 0xdf) == 0x45) {
                  if (pjVar5->type == json_integer) {
                    pjVar5->type = json_double;
                    (pjVar5->u).dbl = (double)(pjVar5->u).integer;
                  }
                  uVar22 = uVar22 & 0xfffff977 | 0x400;
                  goto LAB_00131421;
                }
LAB_00131478:
                if ((uVar22 >> 8 & 1) != 0) {
                  if (pjVar5->type == json_integer) {
                    (pjVar5->u).integer = -(pjVar5->u).integer;
                  }
                  else {
                    (pjVar5->u).integer = (pjVar5->u).integer ^ 0x8000000000000000;
                  }
                }
                bVar4 = true;
                uVar24 = uVar22 | 3;
                goto LAB_001314a0;
              }
              uVar22 = (uint)(bVar9 == 0x2d) << 0xc | uVar22 | 0x800;
            }
            else {
              if (uVar28 != 0x2e) {
                if (uVar28 == 0x2d) goto LAB_00130b59;
                goto LAB_001311ff;
              }
              if (jVar25 != json_integer) {
                if ((uVar22 >> 10 & 1) == 0) {
LAB_00131398:
                  if (local_168 == 0) {
                    uVar18 = local_158._88_8_ & 0xffffffff;
                    uVar27 = (ulong)local_158.cur_col;
                    pcVar20 = "%d:%d: Expected digit after `.`";
                    goto LAB_001319da;
                  }
                  local_170 = (char *)(double)local_e0;
                  dVar2 = pow(10.0,(double)local_168);
                  (pjVar5->u).dbl = (double)local_170 / dVar2 + (pjVar5->u).dbl;
                  goto LAB_001313ea;
                }
LAB_0013142f:
                if (local_168 == 0) {
                  uVar18 = local_158._88_8_ & 0xffffffff;
                  uVar27 = (ulong)local_158.cur_col;
                  pcVar20 = "%d:%d: Expected digit after `e`";
                  goto LAB_001319da;
                }
                lVar16 = -local_e8;
                if ((uVar22 >> 0xc & 1) == 0) {
                  lVar16 = local_e8;
                }
                dVar2 = pow(10.0,(double)lVar16);
                (pjVar5->u).dbl = dVar2 * (pjVar5->u).dbl;
                goto LAB_00131478;
              }
              if (local_168 == 0) {
                uVar18 = local_158._88_8_ & 0xffffffff;
                uVar27 = (ulong)local_158.cur_col;
                pcVar20 = "%d:%d: Expected digit before `.`";
                goto LAB_001319da;
              }
              pjVar5->type = json_double;
              (pjVar5->u).dbl = (double)(pjVar5->u).integer;
LAB_00131421:
              local_168 = 0;
            }
          }
          else {
            uVar24 = (uint)(char)bVar9;
            uVar26 = (ulong)uVar24;
            lVar16 = local_168 + 1;
            if ((jVar25 == json_integer) || ((uVar22 & 0x400) != 0)) {
              if ((uVar22 >> 10 & 1) == 0) {
                if ((uVar22 >> 9 & 1) != 0) {
                  uVar18 = local_158._88_8_ & 0xffffffff;
                  uVar27 = (ulong)local_158.cur_col;
                  pcVar20 = "%d:%d: Unexpected `0` before `%c`";
                  goto LAB_00131c4e;
                }
                uVar28 = uVar22 | 0x200;
                if (bVar9 != 0x30) {
                  uVar28 = uVar22;
                }
                if (local_168 == 0) {
                  uVar22 = uVar28;
                }
                (pjVar5->u).integer = (long)(int)uVar24 + (pjVar5->u).integer * 10 + -0x30;
                local_168 = lVar16;
              }
              else {
                uVar22 = uVar22 | 0x800;
                local_e8 = (long)(int)uVar24 + local_e8 * 10 + -0x30;
                local_168 = lVar16;
              }
            }
            else {
              local_e0 = (long)(int)uVar24 + local_e0 * 10 + -0x30;
              local_168 = lVar16;
            }
          }
        }
        else {
          uVar24 = uVar22;
          if (jVar25 == json_object) {
            if (uVar28 < 0x20) {
              if (uVar28 == 9) goto LAB_0013118f;
              if (uVar28 == 10) goto LAB_00130dc7;
              if (uVar28 != 0xd) goto LAB_00131bca;
              goto LAB_0013118f;
            }
            if (uVar28 < 0x2c) {
              if (uVar28 == 0x20) goto LAB_0013118f;
              if (uVar28 != 0x22) {
LAB_00131bca:
                uVar26 = (ulong)(uint)(int)(char)bVar9;
                uVar18 = local_158._88_8_ & 0xffffffff;
                uVar27 = (ulong)local_158.cur_col;
                pcVar20 = "%d:%d: Unexpected `%c` in object";
LAB_00131c4e:
                snprintf((char *)&local_b8,0x80,pcVar20,uVar18,uVar27,uVar26);
LAB_001319ee:
                if (error_buf != (char *)0x0) {
                  if ((char)local_b8 == '\0') {
                    builtin_strncpy(error_buf,"Unknown error",0xe);
                  }
                  else {
                    strcpy(error_buf,(char *)&local_b8);
                  }
                }
                pvVar7 = local_158.settings.user_data;
                p_Var6 = local_158.settings.memory_free;
                iVar13 = local_158.first_pass;
                ppjVar17 = &local_160;
                if (local_158.first_pass == 0) {
                  ppjVar17 = &local_f0;
                }
                pjVar5 = *ppjVar17;
                while (pjVar5 != (json_value *)0x0) {
                  pjVar1 = (json_value *)(pjVar5->_reserved).object_mem;
                  (*p_Var6)(pjVar5,pvVar7);
                  pjVar5 = pjVar1;
                }
                if (iVar13 == 0) {
                  json_value_free_ex(&local_158.settings,local_160);
                }
                return (json_value *)0x0;
              }
              if ((uVar22 & 4) != 0) {
                uVar18 = local_158._88_8_ & 0xffffffff;
                uVar27 = (ulong)local_158.cur_col;
                pcVar20 = "%d:%d: Expected , before \"";
                goto LAB_001319da;
              }
              uVar24 = uVar22 | 0x20;
              local_180 = (local_178->_reserved).next_alloc;
              uVar27 = 0;
            }
            else {
              if (uVar28 != 0x2c) {
                if (uVar28 == 0x7d) goto LAB_00130cc2;
                goto LAB_00131bca;
              }
              if ((uVar22 & 4) == 0) goto LAB_00131bca;
              uVar24 = uVar22 & 0xffffff73;
            }
          }
LAB_001314a0:
          uVar22 = uVar24;
          if ((uVar24 & 2) != 0) {
            uVar22 = uVar24 & 0xfffffffd;
            local_158.ptr = local_158.ptr + -1;
          }
          if (bVar4) {
            p_Var23 = local_178->parent;
            if (p_Var23 == (_json_value *)0x0) {
              uVar22 = uVar22 & 0xfffffffa | 0x84;
              bVar4 = false;
            }
            else {
              jVar25 = p_Var23->type;
              if (local_158.first_pass == 0) {
                if (jVar25 == json_array) {
                  *(json_value **)((p_Var23->u).string.ptr + (ulong)(p_Var23->u).string.length * 8)
                       = local_178;
                  p_Var23 = local_178->parent;
                }
                else if (jVar25 == json_object) {
                  (p_Var23->u).object.values[(p_Var23->u).string.length].value = local_178;
                }
              }
              uVar24 = (p_Var23->u).boolean + 1;
              (p_Var23->u).string.length = uVar24;
              if (local_158.uint_max < uVar24) goto LAB_001319c4;
              uVar22 = (uint)(jVar25 == json_array) << 3 | uVar22 & 0xfffffffa | 4;
              bVar4 = false;
              local_178 = local_178->parent;
            }
          }
        }
      }
      else if (uVar28 < 0xd) {
        if (uVar28 != 9) {
          if (uVar28 != 10) goto LAB_001310a2;
LAB_00130dc7:
          local_158.cur_col = 0;
          local_158.cur_line = local_158.cur_line + 1;
        }
      }
      else if ((uVar28 != 0xd) && (uVar28 != 0x20)) {
        if (uVar28 == 0x5d) {
          if ((local_178 != (json_value *)0x0) && (local_178->type == json_array)) {
LAB_00130cc2:
            uVar24 = (uVar22 & 0xffffff72) + 1;
            bVar4 = true;
            goto LAB_001314a0;
          }
          uVar18 = local_158._88_8_ & 0xffffffff;
          uVar27 = (ulong)local_158.cur_col;
          pcVar20 = "%d:%d: Unexpected ]";
          goto LAB_001319da;
        }
LAB_001310a2:
        if ((uVar22 & 4) == 0) {
          if ((uVar22 & 0x40) == 0) {
            uVar24 = uVar22 & 0xffffff33;
            if (0x6d < uVar28) {
              if (uVar28 == 0x6e) {
                if (((((long)pbVar19 - (long)json < 3) ||
                     (local_158.ptr = (char *)((byte *)json + 1), ((byte *)json)[1] != 0x75)) ||
                    (local_158.ptr = (char *)((byte *)json + 2), ((byte *)json)[2] != 0x6c)) ||
                   (local_158.ptr = (char *)((byte *)json + 3), ((byte *)json)[3] != 0x6c)) {
LAB_00131baf:
                  uVar18 = local_158._88_8_ & 0xffffffff;
                  uVar27 = (ulong)local_158.cur_col;
                  pcVar20 = "%d:%d: Unknown value";
                  goto LAB_001319da;
                }
                jVar25 = json_null;
LAB_00131753:
                iVar13 = new_value(&local_158,&local_178,&local_160,&local_f0,jVar25);
                if (iVar13 == 0) goto LAB_00131c67;
              }
              else {
                if (uVar28 != 0x74) {
                  if (uVar28 != 0x7b) goto LAB_00131770;
                  iVar13 = new_value(&local_158,&local_178,&local_160,&local_f0,json_object);
                  uVar22 = uVar24;
                  goto LAB_0013183e;
                }
                if ((((long)pbVar19 - (long)json < 3) ||
                    (local_158.ptr = (char *)((byte *)json + 1), ((byte *)json)[1] != 0x72)) ||
                   ((local_158.ptr = (char *)((byte *)json + 2), ((byte *)json)[2] != 0x75 ||
                    (local_158.ptr = (char *)((byte *)json + 3), ((byte *)json)[3] != 0x65))))
                goto LAB_00131baf;
                iVar13 = new_value(&local_158,&local_178,&local_160,&local_f0,json_boolean);
                if (iVar13 == 0) goto LAB_00131c67;
                (local_178->u).boolean = 1;
              }
              bVar4 = true;
              goto LAB_001314a0;
            }
            if (uVar28 == 0x22) {
              iVar13 = new_value(&local_158,&local_178,&local_160,&local_f0,json_string);
              if (iVar13 != 0) {
                uVar22 = uVar24 | 0x20;
                local_180 = (_json_value *)(local_178->u).object.values;
                uVar27 = 0;
                goto LAB_0013118f;
              }
            }
            else if (uVar28 == 0x5b) {
              iVar13 = new_value(&local_158,&local_178,&local_160,&local_f0,json_array);
LAB_0013183e:
              if (iVar13 != 0) goto LAB_0013118f;
            }
            else {
              if (uVar28 == 0x66) {
                if ((((long)pbVar19 - (long)json < 4) ||
                    (local_158.ptr = (char *)((byte *)json + 1), ((byte *)json)[1] != 0x61)) ||
                   ((local_158.ptr = (char *)((byte *)json + 2), ((byte *)json)[2] != 0x6c ||
                    ((local_158.ptr = (char *)((byte *)json + 3), ((byte *)json)[3] != 0x73 ||
                     (local_158.ptr = (char *)((byte *)json + 4), ((byte *)json)[4] != 0x65))))))
                goto LAB_00131baf;
                jVar25 = json_boolean;
                goto LAB_00131753;
              }
LAB_00131770:
              ppuVar14 = __ctype_b_loc();
              if (((*(byte *)((long)*ppuVar14 + (long)(char)bVar9 * 2 + 1) & 8) == 0) &&
                 (bVar9 != 0x2d)) {
                uVar26 = (ulong)(uint)(int)(char)bVar9;
                uVar18 = local_158._88_8_ & 0xffffffff;
                uVar27 = (ulong)local_158._88_8_ >> 0x20;
                pcVar20 = "%d:%d: Unexpected %c when seeking value";
                goto LAB_00131c4e;
              }
              iVar13 = new_value(&local_158,&local_178,&local_160,&local_f0,json_integer);
              if (iVar13 != 0) {
                if (local_158.first_pass == 0) {
                  while (((((*ppuVar14)[(char)uVar28] >> 0xb & 1) != 0 ||
                          ((uVar28 - 0x2b < 0x3b &&
                           ((0x40000000400000dU >> ((ulong)(uVar28 - 0x2b) & 0x3f) & 1) != 0)))) &&
                         (local_158.ptr = local_158.ptr + 1, (byte *)local_158.ptr != pbVar19))) {
                    uVar28 = (uint)(byte)*local_158.ptr;
                  }
                  uVar24 = uVar24 | 3;
                  bVar4 = true;
                }
                else {
                  if (bVar9 == 0x2d) {
                    uVar22 = uVar22 & 0xffffe033 | 0x100;
                    local_168 = 0;
                    local_e8 = 0;
                    local_e0 = 0;
                    goto LAB_0013118f;
                  }
                  uVar24 = uVar22 & 0xffffe033 | 2;
                  local_168 = 0;
                  local_e8 = 0;
                  local_e0 = 0;
                }
                goto LAB_001314a0;
              }
            }
LAB_00131c67:
            acStack_a6[0] = 'f';
            acStack_a6[1] = 'a';
            acStack_a6[2] = 'i';
            acStack_a6[3] = 'l';
            acStack_a6[4] = 'u';
            acStack_a6[5] = 'r';
            acStack_a6[6] = 'e';
            acStack_a6[7] = '\0';
            uStack_a8 = 0x206e;
            local_b8._0_1_ = 'M';
            local_b8._1_1_ = 'e';
            local_b8._2_1_ = 'm';
            local_b8._3_1_ = 'o';
            local_b8._4_1_ = 'r';
            local_b8._5_1_ = 'y';
            local_b8._6_1_ = ' ';
            local_b8._7_1_ = 'a';
            uStack_b0 = 0x6c6c;
            uStack_ae = 0x6f697461636f;
            goto LAB_001319ee;
          }
          if (bVar9 != 0x3a) {
            uVar26 = (ulong)(uint)(int)(char)bVar9;
            uVar18 = local_158._88_8_ & 0xffffffff;
            uVar27 = (ulong)local_158.cur_col;
            pcVar20 = "%d:%d: Expected : before %c";
            goto LAB_00131c4e;
          }
          uVar22 = uVar22 & 0xffffff3b;
        }
        else {
          if (bVar9 != 0x2c) {
            uVar26 = (ulong)(uint)(int)(char)bVar9;
            uVar18 = local_158._88_8_ & 0xffffffff;
            uVar27 = (ulong)local_158.cur_col;
            pcVar20 = "%d:%d: Expected , before %c";
            goto LAB_00131c4e;
          }
          uVar22 = uVar22 & 0xffffff7b;
        }
      }
    }
    else {
      if ((uVar22 & 0x6000) != 0) {
        if ((uVar22 >> 0xd & 1) == 0) {
          if ((uVar22 >> 0xe & 1) == 0) goto code_r0x00130afb;
          if (bVar9 == 0x2a) {
            if ((json < local_c0) && (((byte *)json)[1] == 0x2f)) {
              local_158.ptr = (char *)((byte *)json + 1);
              uVar22 = uVar22 & 0xffff9fff;
            }
          }
          else if (uVar28 == 0) {
            uVar18 = local_158._88_8_ & 0xffffffff;
            uVar27 = (ulong)local_158.cur_col;
            pcVar20 = "%d:%d: Unexpected EOF in block comment";
            goto LAB_001319da;
          }
        }
        else if ((bVar9 < 0xe) && ((0x2401U >> (uVar28 & 0x1f) & 1) != 0)) {
          uVar22 = uVar22 & 0xffffdfff;
          local_158.ptr = (char *)((byte *)json + -1);
        }
        goto LAB_0013118f;
      }
      if (bVar9 != 0x2f) goto code_r0x00130afb;
      if (((uVar22 & 0x88) == 0) && (local_178->type != json_object)) {
        uVar18 = local_158._88_8_ & 0xffffffff;
        uVar27 = (ulong)local_158.cur_col;
        pcVar20 = "%d:%d: Comment not allowed here";
        goto LAB_001319da;
      }
      local_158.ptr = (char *)((byte *)json + 1);
      if ((byte *)local_158.ptr == pbVar19) {
        uVar18 = local_158._88_8_ & 0xffffffff;
        uVar27 = (ulong)local_158.cur_col;
        pcVar20 = "%d:%d: EOF unexpected";
        goto LAB_001319da;
      }
      bVar9 = *local_158.ptr;
      if (bVar9 == 0x2a) {
        uVar22 = uVar22 | 0x4000;
        goto LAB_0013118f;
      }
      if (bVar9 != 0x2f) {
        uVar26 = (ulong)(uint)(int)(char)bVar9;
        uVar18 = local_158._88_8_ & 0xffffffff;
        uVar27 = (ulong)local_158.cur_col;
        pcVar20 = "%d:%d: Unexpected `%c` in comment opening sequence";
        goto LAB_00131c4e;
      }
      uVar22 = uVar22 | 0x2000;
    }
  }
  else {
    if (bVar9 == 0) goto LAB_001319ac;
    if (local_158.uint_max < uVar24) {
LAB_001319c4:
      uVar18 = local_158._88_8_ & 0xffffffff;
      uVar27 = (ulong)local_158._88_8_ >> 0x20;
      pcVar20 = "%d:%d: Too long (caught overflow)";
LAB_001319da:
      snprintf((char *)&local_b8,0x80,pcVar20,uVar18,uVar27);
      goto LAB_001319ee;
    }
    if ((uVar22 & 0x10) != 0) {
      uVar22 = uVar22 & 0xffffffef;
      switch(bVar9) {
      case 0x6e:
        if (local_158.first_pass == 0) {
          *(undefined1 *)((long)&local_180->parent + uVar27) = 10;
        }
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_00130c05_caseD_6f:
        if (local_158.first_pass == 0) {
          *(byte *)((long)&local_180->parent + uVar27) = bVar9;
        }
        break;
      case 0x72:
        if (local_158.first_pass == 0) {
          *(undefined1 *)((long)&local_180->parent + uVar27) = 0xd;
        }
        break;
      case 0x74:
        if (local_158.first_pass == 0) {
          *(undefined1 *)((long)&local_180->parent + uVar27) = 9;
        }
        break;
      case 0x75:
        local_170 = error_buf;
        local_d8 = uVar27;
        if (3 < (long)pbVar19 - (long)json) {
          local_158.ptr = (char *)((byte *)json + 1);
          uVar8 = hex_value(((byte *)json)[1]);
          if (uVar8 != 0xff) {
            local_158.ptr = (char *)((byte *)json + 2);
            bVar9 = hex_value(((byte *)json)[2]);
            if (bVar9 != 0xff) {
              local_158.ptr = (char *)((byte *)json + 3);
              uVar10 = hex_value(((byte *)json)[3]);
              if (uVar10 != 0xff) {
                local_158.ptr = (char *)((byte *)json + 4);
                bVar11 = hex_value(((byte *)json)[4]);
                if (bVar11 != 0xff) {
                  bVar21 = uVar8 << 4 | bVar9;
                  bVar11 = bVar11 | uVar10 << 4;
                  uVar3 = CONCAT11(bVar21,bVar11);
                  uVar24 = (uint)uVar3;
                  if ((byte)(uVar8 << 4 | bVar9 & 0xf8) != 0xd8) {
                    iVar13 = (int)local_d8;
                    error_buf = local_170;
                    if (uVar24 < 0x80) {
                      if (local_158.first_pass == 0) {
                        *(byte *)((long)&local_180->parent + (local_d8 & 0xffffffff)) = bVar11;
                      }
                      uVar27 = (ulong)(iVar13 + 1);
                    }
                    else if (bVar21 < 8) {
                      if (local_158.first_pass == 0) {
                        *(byte *)((long)&local_180->parent + (local_d8 & 0xffffffff)) =
                             (byte)(uVar3 >> 6) | 0xc0;
                        uVar27 = (ulong)(iVar13 + 2);
                        *(byte *)((long)&local_180->parent + (ulong)(iVar13 + 1)) =
                             bVar11 & 0x3f | 0x80;
                      }
                      else {
                        uVar27 = (ulong)(iVar13 + 2);
                      }
                    }
                    else if (local_158.first_pass == 0) {
                      *(byte *)((long)&local_180->parent + (local_d8 & 0xffffffff)) =
                           bVar21 >> 4 | 0xe0;
                      *(byte *)((long)&local_180->parent + (ulong)(iVar13 + 1)) =
                           (byte)(uVar3 >> 6) & 0x3f | 0x80;
                      uVar27 = (ulong)(iVar13 + 3);
                      *(byte *)((long)&local_180->parent + (ulong)(iVar13 + 2)) =
                           bVar11 & 0x3f | 0x80;
                    }
                    else {
                      uVar27 = (ulong)(iVar13 + 3);
                    }
                    goto LAB_0013118f;
                  }
                  local_cc = uVar24;
                  if (((5 < (long)pbVar19 - (long)((byte *)json + 4)) &&
                      (local_158.ptr = (char *)((byte *)json + 5), ((byte *)json)[5] == 0x5c)) &&
                     (local_158.ptr = (char *)((byte *)json + 6), ((byte *)json)[6] == 0x75)) {
                    local_158.ptr = (char *)((byte *)json + 7);
                    uVar8 = hex_value(((byte *)json)[7]);
                    if (uVar8 != 0xff) {
                      local_158.ptr = (char *)((byte *)json + 8);
                      bVar21 = hex_value(((byte *)json)[8]);
                      if (bVar21 != 0xff) {
                        local_158.ptr = (char *)((byte *)json + 9);
                        uVar8 = hex_value(((byte *)json)[9]);
                        if (uVar8 != 0xff) {
                          local_158.ptr = (char *)((byte *)json + 10);
                          bVar12 = hex_value(((byte *)json)[10]);
                          if (bVar12 != 0xff) {
                            iVar13 = (int)local_d8;
                            if (local_158.first_pass == 0) {
                              bVar12 = bVar12 | uVar8 << 4;
                              *(byte *)((long)&local_180->parent + (local_d8 & 0xffffffff)) =
                                   bVar9 & 3 | 0xf0;
                              *(byte *)((long)&local_180->parent + (ulong)(iVar13 + 1)) =
                                   bVar11 >> 2 | 0x90;
                              *(byte *)((long)&local_180->parent + (ulong)(iVar13 + 2)) =
                                   (byte)(((bVar21 & 3) << 8 | (uint)bVar12 | local_cc << 10) >> 6)
                                   & 0x3f | 0x80;
                              *(byte *)((long)&local_180->parent + (ulong)(iVar13 + 3)) =
                                   bVar12 & 0x3f | 0x80;
                            }
                            uVar27 = (ulong)(iVar13 + 4);
                            error_buf = local_170;
                            goto LAB_0013118f;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        snprintf((char *)&local_b8,0x80,"Invalid character value `%c` (at %d:%d)",0x75,
                 local_158._88_8_ & 0xffffffff,(ulong)local_158._88_8_ >> 0x20);
        error_buf = local_170;
        goto LAB_001319ee;
      default:
        if (bVar9 == 0x66) {
          if (local_158.first_pass == 0) {
            *(undefined1 *)((long)&local_180->parent + uVar27) = 0xc;
          }
        }
        else {
          if (bVar9 != 0x62) goto switchD_00130c05_caseD_6f;
          if (local_158.first_pass == 0) {
            *(undefined1 *)((long)&local_180->parent + uVar27) = 8;
          }
        }
      }
      uVar27 = (ulong)(uVar24 + 1);
      goto LAB_0013118f;
    }
    if (bVar9 == 0x22) {
      if (local_158.first_pass == 0) {
        *(undefined1 *)((long)&local_180->parent + uVar27) = 0;
      }
      uVar22 = uVar22 & 0xffffffcf;
      if (local_178->type != json_object) {
        uVar28 = 0x22;
        if (local_178->type == json_string) {
          (local_178->u).string.length = uVar24;
          bVar4 = true;
        }
        local_180 = (_json_value *)0x0;
        goto LAB_00130ae7;
      }
      if (local_158.first_pass == 0) {
        *(anon_union_8_2_291a86ad_for__reserved *)
         ((local_178->u).string.ptr + (ulong)(local_178->u).string.length * 0x18) =
             local_178->_reserved;
        paVar15 = &local_178->_reserved;
        (local_178->u).object.values[(local_178->u).string.length].name_length = uVar24;
      }
      else {
        paVar15 = (anon_union_8_2_291a86ad_for__reserved *)&(local_178->u).object.values;
      }
      paVar15->next_alloc =
           (_json_value *)((long)&paVar15->next_alloc->parent + (ulong)(uVar24 + 1));
      uVar22 = uVar22 | 0x48;
      local_180 = (_json_value *)0x0;
    }
    else {
      if (bVar9 != 0x5c) goto switchD_00130c05_caseD_6f;
      uVar22 = uVar22 | 0x10;
    }
  }
LAB_0013118f:
  json = local_158.ptr + 1;
  goto LAB_00130a86;
}

Assistant:

json_value * json_parse_ex (json_settings * settings,
                            const json_char * json,
                            size_t length,
                            char * error_buf)
{
   json_char error [json_error_max];
   const json_char * end;
   json_value *top, *root = NULL, * alloc = 0;
   json_state state = EMPTY_STATE_STRUCT;
   long flags;
   long num_digits = 0, num_e = 0;
   json_int_t num_fraction = 0;

   /* Skip UTF-8 BOM
    */
   if (length >= 3 && ((unsigned char) json [0]) == 0xEF
                   && ((unsigned char) json [1]) == 0xBB
                   && ((unsigned char) json [2]) == 0xBF)
   {
      json += 3;
      length -= 3;
   }

   error[0] = '\0';
   end = (json + length);

   memcpy (&state.settings, settings, sizeof (json_settings));

   if (!state.settings.memory_alloc)
      state.settings.memory_alloc = default_alloc;

   if (!state.settings.memory_free)
      state.settings.memory_free = default_free;

   memset (&state.uint_max, 0xFF, sizeof (state.uint_max));
   memset (&state.ulong_max, 0xFF, sizeof (state.ulong_max));

   state.uint_max -= 8; /* limit of how much can be added before next check */
   state.ulong_max -= 8;

   for (state.first_pass = 1; state.first_pass >= 0; -- state.first_pass)
   {
      json_uchar uchar;
      unsigned char uc_b1, uc_b2, uc_b3, uc_b4;
      json_char * string = 0;
      unsigned int string_length = 0;

      top = root = 0;
      flags = flag_seek_value;

      state.cur_line = 1;

      for (state.ptr = json ;; ++ state.ptr)
      {
         json_char b = (state.ptr == end ? 0 : *state.ptr);

         if (flags & flag_string)
         {
            if (!b)
            {  snprintf (error, sizeof(error), "Unexpected EOF in string (at %d:%d)", line_and_col);
               goto e_failed;
            }

            if (string_length > state.uint_max)
               goto e_overflow;

            if (flags & flag_escaped)
            {
               flags &= ~ flag_escaped;

               switch (b)
               {
                  case 'b':  string_add ('\b');  break;
                  case 'f':  string_add ('\f');  break;
                  case 'n':  string_add ('\n');  break;
                  case 'r':  string_add ('\r');  break;
                  case 't':  string_add ('\t');  break;
                  case 'u':

                    if (end - state.ptr < 4 ||
                        (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                    {
                        snprintf (error, sizeof(error), "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                        goto e_failed;
                    }

                    uc_b1 = (uc_b1 << 4) | uc_b2;
                    uc_b2 = (uc_b3 << 4) | uc_b4;
                    uchar = (uc_b1 << 8) | uc_b2;

                    if ((uchar & 0xF800) == 0xD800) {
                        json_uchar uchar2;

                        if (end - state.ptr < 6 || (*++ state.ptr) != '\\' || (*++ state.ptr) != 'u' ||
                            (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                        {
                            snprintf (error, sizeof(error), "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                            goto e_failed;
                        }

                        uc_b1 = (uc_b1 << 4) | uc_b2;
                        uc_b2 = (uc_b3 << 4) | uc_b4;
                        uchar2 = (uc_b1 << 8) | uc_b2;

                        uchar = 0x010000 | ((uchar & 0x3FF) << 10) | (uchar2 & 0x3FF);
                    }

                    if (sizeof (json_char) >= sizeof (json_uchar) || (uchar <= 0x7F))
                    {
                       string_add ((json_char) uchar);
                       break;
                    }

                    if (uchar <= 0x7FF)
                    {
                        if (state.first_pass)
                           string_length += 2;
                        else
                        {  string [string_length ++] = 0xC0 | (uchar >> 6);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (uchar <= 0xFFFF) {
                        if (state.first_pass)
                           string_length += 3;
                        else
                        {  string [string_length ++] = 0xE0 | (uchar >> 12);
                           string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (state.first_pass)
                       string_length += 4;
                    else
                    {  string [string_length ++] = 0xF0 | (uchar >> 18);
                       string [string_length ++] = 0x80 | ((uchar >> 12) & 0x3F);
                       string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                       string [string_length ++] = 0x80 | (uchar & 0x3F);
                    }

                    break;

                  default:
                     string_add (b);
               };

               continue;
            }

            if (b == '\\')
            {
               flags |= flag_escaped;
               continue;
            }

            if (b == '"')
            {
               if (!state.first_pass)
                  string [string_length] = 0;

               flags &= ~ flag_string;
               string = 0;

               switch (top->type)
               {
                  case json_string:

                     top->u.string.length = string_length;
                     flags |= flag_next;

                     break;

                  case json_object:

                     if (state.first_pass)
                        (*(json_char **) &top->u.object.values) += string_length + 1;
                     else
                     {
                        top->u.object.values [top->u.object.length].name
                           = (json_char *) top->_reserved.object_mem;

                        top->u.object.values [top->u.object.length].name_length
                           = string_length;

                        (*(json_char **) &top->_reserved.object_mem) += string_length + 1;
                     }

                     flags |= flag_seek_value | flag_need_colon;
                     continue;

                  default:
                     break;
               };
            }
            else
            {
               string_add (b);
               continue;
            }
         }

         if (state.settings.settings & json_enable_comments)
         {
            if (flags & (flag_line_comment | flag_block_comment))
            {
               if (flags & flag_line_comment)
               {
                  if (b == '\r' || b == '\n' || !b)
                  {
                     flags &= ~ flag_line_comment;
                     -- state.ptr;  /* so null can be reproc'd */
                  }

                  continue;
               }

               if (flags & flag_block_comment)
               {
                  if (!b)
                  {  snprintf (error, sizeof(error), "%d:%d: Unexpected EOF in block comment", line_and_col);
                     goto e_failed;
                  }

                  if (b == '*' && state.ptr < (end - 1) && state.ptr [1] == '/')
                  {
                     flags &= ~ flag_block_comment;
                     ++ state.ptr;  /* skip closing sequence */
                  }

                  continue;
               }
            }
            else if (b == '/')
            {
               if (! (flags & (flag_seek_value | flag_done)) && top->type != json_object)
               {  snprintf (error, sizeof(error), "%d:%d: Comment not allowed here", line_and_col);
                  goto e_failed;
               }

               if (++ state.ptr == end)
               {  snprintf (error, sizeof(error), "%d:%d: EOF unexpected", line_and_col);
                  goto e_failed;
               }

               switch (b = *state.ptr)
               {
                  case '/':
                     flags |= flag_line_comment;
                     continue;

                  case '*':
                     flags |= flag_block_comment;
                     continue;

                  default:
                     snprintf (error, sizeof(error), "%d:%d: Unexpected `%c` in comment opening sequence", line_and_col, b);
                     goto e_failed;
               };
            }
         }

         if (flags & flag_done)
         {
            if (!b)
               break;

            switch (b)
            {
               whitespace:
                  continue;

               default:

                  snprintf (error, sizeof(error), "%d:%d: Trailing garbage: `%c`",
                           state.cur_line, state.cur_col, b);

                  goto e_failed;
            };
         }

         if (flags & flag_seek_value)
         {
            switch (b)
            {
               whitespace:
                  continue;

               case ']':

                  if (top && top->type == json_array)
                     flags = (flags & ~ (flag_need_comma | flag_seek_value)) | flag_next;
                  else
                  {  snprintf (error, sizeof(error), "%d:%d: Unexpected ]", line_and_col);
                     goto e_failed;
                  }

                  break;

               default:

                  if (flags & flag_need_comma)
                  {
                     if (b == ',')
                     {  flags &= ~ flag_need_comma;
                        continue;
                     }
                     else
                     {
                        snprintf (error, sizeof(error), "%d:%d: Expected , before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  if (flags & flag_need_colon)
                  {
                     if (b == ':')
                     {  flags &= ~ flag_need_colon;
                        continue;
                     }
                     else
                     {
                        snprintf (error, sizeof(error), "%d:%d: Expected : before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  flags &= ~ flag_seek_value;

                  switch (b)
                  {
                     case '{':

                        if (!new_value (&state, &top, &root, &alloc, json_object))
                           goto e_alloc_failure;

                        continue;

                     case '[':

                        if (!new_value (&state, &top, &root, &alloc, json_array))
                           goto e_alloc_failure;

                        flags |= flag_seek_value;
                        continue;

                     case '"':

                        if (!new_value (&state, &top, &root, &alloc, json_string))
                           goto e_alloc_failure;

                        flags |= flag_string;

                        string = top->u.string.ptr;
                        string_length = 0;

                        continue;

                     case 't':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'r' ||
                            *(++ state.ptr) != 'u' || *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        top->u.boolean = 1;

                        flags |= flag_next;
                        break;

                     case 'f':

                        if ((end - state.ptr) < 4 || *(++ state.ptr) != 'a' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 's' ||
                            *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     case 'n':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'u' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 'l')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_null))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     default:

                        if (isdigit (b) || b == '-')
                        {
                           if (!new_value (&state, &top, &root, &alloc, json_integer))
                              goto e_alloc_failure;

                           if (!state.first_pass)
                           {
                              while (isdigit (b) || b == '+' || b == '-'
                                        || b == 'e' || b == 'E' || b == '.')
                              {
                                 if ( (++ state.ptr) == end)
                                 {
                                    b = 0;
                                    break;
                                 }

                                 b = *state.ptr;
                              }

                              flags |= flag_next | flag_reproc;
                              break;
                           }

                           flags &= ~ (flag_num_negative | flag_num_e |
                                        flag_num_e_got_sign | flag_num_e_negative |
                                           flag_num_zero);

                           num_digits = 0;
                           num_fraction = 0;
                           num_e = 0;

                           if (b != '-')
                           {
                              flags |= flag_reproc;
                              break;
                           }

                           flags |= flag_num_negative;
                           continue;
                        }
                        else
                        {  snprintf (error, sizeof(error), "%d:%d: Unexpected %c when seeking value", line_and_col, b);
                           goto e_failed;
                        }
                  };
            };
         }
         else
         {
            switch (top->type)
            {
            case json_object:

               switch (b)
               {
                  whitespace:
                     continue;

                  case '"':

                     if (flags & flag_need_comma)
                     {  snprintf (error, sizeof(error), "%d:%d: Expected , before \"", line_and_col);
                        goto e_failed;
                     }

                     flags |= flag_string;

                     string = (json_char *) top->_reserved.object_mem;
                     string_length = 0;

                     break;

                  case '}':

                     flags = (flags & ~ flag_need_comma) | flag_next;
                     break;

                  case ',':

                     if (flags & flag_need_comma)
                     {
                        flags &= ~ flag_need_comma;
                        break;
                     }

                  default:
                     snprintf (error, sizeof(error), "%d:%d: Unexpected `%c` in object", line_and_col, b);
                     goto e_failed;
               };

               break;

            case json_integer:
            case json_double:

               if (isdigit (b))
               {
                  ++ num_digits;

                  if (top->type == json_integer || flags & flag_num_e)
                  {
                     if (! (flags & flag_num_e))
                     {
                        if (flags & flag_num_zero)
                        {  snprintf (error, sizeof(error), "%d:%d: Unexpected `0` before `%c`", line_and_col, b);
                           goto e_failed;
                        }

                        if (num_digits == 1 && b == '0')
                           flags |= flag_num_zero;
                     }
                     else
                     {
                        flags |= flag_num_e_got_sign;
                        num_e = (num_e * 10) + (b - '0');
                        continue;
                     }

                     top->u.integer = (top->u.integer * 10) + (b - '0');
                     continue;
                  }

                  num_fraction = (num_fraction * 10) + (b - '0');
                  continue;
               }

               if (b == '+' || b == '-')
               {
                  if ( (flags & flag_num_e) && !(flags & flag_num_e_got_sign))
                  {
                     flags |= flag_num_e_got_sign;

                     if (b == '-')
                        flags |= flag_num_e_negative;

                     continue;
                  }
               }
               else if (b == '.' && top->type == json_integer)
               {
                  if (!num_digits)
                  {  snprintf (error, sizeof(error), "%d:%d: Expected digit before `.`", line_and_col);
                     goto e_failed;
                  }

                  top->type = json_double;
                  top->u.dbl = (double) top->u.integer;

                  num_digits = 0;
                  continue;
               }

               if (! (flags & flag_num_e))
               {
                  if (top->type == json_double)
                  {
                     if (!num_digits)
                     {  snprintf (error, sizeof(error), "%d:%d: Expected digit after `.`", line_and_col);
                        goto e_failed;
                     }

                     top->u.dbl += ((double) num_fraction) / (pow (10.0, (double) num_digits));
                  }

                  if (b == 'e' || b == 'E')
                  {
                     flags |= flag_num_e;

                     if (top->type == json_integer)
                     {
                        top->type = json_double;
                        top->u.dbl = (double) top->u.integer;
                     }

                     num_digits = 0;
                     flags &= ~ flag_num_zero;

                     continue;
                  }
               }
               else
               {
                  if (!num_digits)
                  {  snprintf (error, sizeof(error), "%d:%d: Expected digit after `e`", line_and_col);
                     goto e_failed;
                  }

                  top->u.dbl *= pow (10.0, (double)
                      (flags & flag_num_e_negative ? - num_e : num_e));
               }

               if (flags & flag_num_negative)
               {
                  if (top->type == json_integer)
                     top->u.integer = - top->u.integer;
                  else
                     top->u.dbl = - top->u.dbl;
               }

               flags |= flag_next | flag_reproc;
               break;

            default:
               break;
            };
         }

         if (flags & flag_reproc)
         {
            flags &= ~ flag_reproc;
            -- state.ptr;
         }

         if (flags & flag_next)
         {
            flags = (flags & ~ flag_next) | flag_need_comma;

            if (!top->parent)
            {
               /* root value done */

               flags |= flag_done;
               continue;
            }

            if (top->parent->type == json_array)
               flags |= flag_seek_value;

            if (!state.first_pass)
            {
               json_value * parent = top->parent;

               switch (parent->type)
               {
                  case json_object:

                     parent->u.object.values
                        [parent->u.object.length].value = top;

                     break;

                  case json_array:

                     parent->u.array.values
                           [parent->u.array.length] = top;

                     break;

                  default:
                     break;
               };
            }

            if ( (++ top->parent->u.array.length) > state.uint_max)
               goto e_overflow;

            top = top->parent;

            continue;
         }
      }

      alloc = root;
   }

   return root;

e_unknown_value:

   snprintf (error, sizeof(error), "%d:%d: Unknown value", line_and_col);
   goto e_failed;

e_alloc_failure:

   strcpy (error, "Memory allocation failure");
   goto e_failed;

e_overflow:

   snprintf (error, sizeof(error), "%d:%d: Too long (caught overflow)", line_and_col);
   goto e_failed;

e_failed:

   if (error_buf)
   {
      if (*error)
         strcpy (error_buf, error);
      else
         strcpy (error_buf, "Unknown error");
   }

   if (state.first_pass)
      alloc = root;

   while (alloc)
   {
      top = alloc->_reserved.next_alloc;
      state.settings.memory_free (alloc, state.settings.user_data);
      alloc = top;
   }

   if (!state.first_pass)
      json_value_free_ex (&state.settings, root);

   return 0;
}